

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_pair_checker.cpp
# Opt level: O0

void __thiscall my_algorithm::SymbolPairChecker::SymbolPairChecker(SymbolPairChecker *this)

{
  Stack<char> local_88;
  string local_60 [32];
  string local_40 [48];
  SymbolPairChecker *local_10;
  SymbolPairChecker *this_local;
  
  this->_vptr_SymbolPairChecker = (_func_int **)&PTR__SymbolPairChecker_00116cf0;
  local_10 = this;
  std::__cxx11::string::string((string *)&this->_open_symbols);
  std::__cxx11::string::string((string *)&this->_close_symbols);
  data_structures::Stack<char>::Stack(&this->_stack);
  this->_cursor = 0;
  std::__cxx11::string::string(local_40);
  std::__cxx11::string::operator=((string *)&this->_open_symbols,local_40);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::string(local_60);
  std::__cxx11::string::operator=((string *)&this->_close_symbols,local_60);
  std::__cxx11::string::~string(local_60);
  data_structures::Stack<char>::Stack(&local_88);
  data_structures::Stack<char>::operator=(&this->_stack,&local_88);
  data_structures::Stack<char>::~Stack(&local_88);
  return;
}

Assistant:

SymbolPairChecker::SymbolPairChecker() {
        _cursor = 0;
        _open_symbols = std::string();
        _close_symbols = std::string();
        _stack = data_structures::Stack<char>();
    }